

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O2

void __thiscall
xLearn::ReaderTest_SampleFromMemory_Test::ReaderTest_SampleFromMemory_Test
          (ReaderTest_SampleFromMemory_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00159f80;
  return;
}

Assistant:

TEST(ReaderTest, SampleFromMemory) {
  WriteFile();
  // has label
  string lr_file = kTestfilename + "_LR.txt";
  string ffm_file = kTestfilename + "_ffm.txt";
  string csv_file = kTestfilename + "_csv.txt";
  string lr_file_comma = kTestfilename + "_LR_comma.txt";
  string ffm_file_comma = kTestfilename + "_ffm_comma.txt";
  string csv_file_comma = kTestfilename + "_csv_comma.txt";
  // has no label
  string lr_no_file = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file = kTestfilename + "_ffm_no_comma.txt";
  string lr_no_file_comma = kTestfilename + "_LR_no_comma.txt";
  string ffm_no_file_comma = kTestfilename + "_ffm_no_comma.txt";
  // check
  read_from_memory(lr_file, 0);
  read_from_memory(ffm_file, 1);
  read_from_memory(csv_file, 2);
  read_from_memory(lr_no_file, 3);
  read_from_memory(ffm_no_file, 4);

  read_from_memory(lr_file_comma, 0);
  read_from_memory(ffm_file_comma, 1);
  read_from_memory(csv_file_comma, 2);
  read_from_memory(lr_no_file_comma, 3);
  read_from_memory(ffm_no_file_comma, 4);
}